

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

bool vkt::shaderexecutor::ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::
     doContains(IVal *ival,Vector<float,_2> *value)

{
  float fVar1;
  double dVar2;
  long lVar3;
  byte bVar4;
  double *pdVar5;
  bool bVar6;
  double dVar7;
  
  pdVar5 = &ival->m_data[0].m_hi;
  lVar3 = 0;
  bVar6 = false;
  while( true ) {
    fVar1 = value->m_data[lVar3];
    dVar7 = (double)fVar1;
    dVar2 = dVar7;
    if (NAN(fVar1)) {
      dVar2 = INFINITY;
      dVar7 = -INFINITY;
    }
    bVar4 = pdVar5[-1] <= dVar2 && dVar7 <= *pdVar5;
    if ((NAN(fVar1)) && (pdVar5[-1] <= dVar2 && dVar7 <= *pdVar5)) {
      bVar4 = ((Interval *)(pdVar5 + -2))->m_hasNaN;
    }
    if ((bVar4 & 1) == 0) break;
    lVar3 = lVar3 + 1;
    pdVar5 = pdVar5 + 3;
    bVar6 = lVar3 != 1;
    if (bVar6) {
      return bVar6;
    }
  }
  return bVar6;
}

Assistant:

static bool			doContains		(const IVal& ival, const T& value)
	{
		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			if (!contains(ival[ndx], value[ndx]))
				return false;

		return true;
	}